

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O2

bool __thiscall
gmlc::containers::BlockIterator<helics::Translator_const,32,helics::Translator_const*const*>::
checkEquivalence<helics::Translator**>
          (BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> *this,
          Translator **testv,int testoffset)

{
  Translator **ppTVar1;
  
  ppTVar1 = this->vec;
  if ((ppTVar1 != testv) &&
     ((((testv == (Translator **)0x0 || (ppTVar1 == (Translator **)0x0)) ||
       (*testv != (Translator *)0x0)) || (*ppTVar1 != (Translator *)0x0)))) {
    return false;
  }
  return this->offset == testoffset;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }